

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

int compareSymbols(void *a,void *b)

{
  char *__s;
  char *__s_00;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  size_t __n_00;
  uint local_5c;
  size_t sym2_len;
  size_t sym1_len;
  bool sym2_local;
  bool sym1_local;
  char *sym2_name;
  char *sym1_name;
  SortedSymbol *sym2;
  SortedSymbol *sym1;
  void *b_local;
  void *a_local;
  
  if (*(short *)((long)a + 0xc) == *(short *)((long)b + 0xc)) {
    __s = (char *)**a;
    __s_00 = (char *)**b;
    pcVar2 = strchr(__s,0x2e);
    pcVar3 = strchr(__s_00,0x2e);
    if ((pcVar2 != (char *)0x0) == (pcVar3 != (char *)0x0)) {
      if (*(uint *)((long)a + 8) < *(uint *)((long)b + 8)) {
        local_5c = 0xffffffff;
      }
      else {
        local_5c = (uint)(*(uint *)((long)b + 8) < *(uint *)((long)a + 8));
      }
      a_local._4_4_ = local_5c;
    }
    else {
      __n = strlen(__s);
      __n_00 = strlen(__s_00);
      iVar1 = strncmp(__s,__s_00,__n);
      if ((iVar1 == 0) && (__s_00[__n] == '.')) {
        a_local._4_4_ = 0xffffffff;
      }
      else {
        iVar1 = strncmp(__s_00,__s,__n_00);
        if ((iVar1 == 0) && (__s[__n_00] == '.')) {
          a_local._4_4_ = 1;
        }
        else {
          a_local._4_4_ = 1;
          if (pcVar2 != (char *)0x0) {
            a_local._4_4_ = 0xffffffff;
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = 1;
    if (*(ushort *)((long)a + 0xc) < *(ushort *)((long)b + 0xc)) {
      a_local._4_4_ = 0xffffffff;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int compareSymbols(void const *a, void const *b)
{
	struct SortedSymbol const *sym1 = (struct SortedSymbol const *)a;
	struct SortedSymbol const *sym2 = (struct SortedSymbol const *)b;

	if (sym1->addr != sym2->addr)
		return sym1->addr < sym2->addr ? -1 : 1;

	char const *sym1_name = sym1->sym->name;
	char const *sym2_name = sym2->sym->name;
	bool sym1_local = strchr(sym1_name, '.');
	bool sym2_local = strchr(sym2_name, '.');

	if (sym1_local != sym2_local) {
		size_t sym1_len = strlen(sym1_name);
		size_t sym2_len = strlen(sym2_name);

		// Sort parent labels before their child local labels
		if (!strncmp(sym1_name, sym2_name, sym1_len) && sym2_name[sym1_len] == '.')
			return -1;
		if (!strncmp(sym2_name, sym1_name, sym2_len) && sym1_name[sym2_len] == '.')
			return 1;
		// Sort local labels before unrelated global labels
		return sym1_local ? -1 : 1;
	}

	return sym1->idx < sym2->idx ? -1 : sym1->idx > sym2->idx ? 1 : 0;
}